

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  double dVar1;
  char cVar2;
  uint __val;
  pointer ptVar3;
  pointer ptVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  ulong uVar8;
  long lVar9;
  __normal_iterator<time_result_*,_std::vector<time_result,_std::allocator<time_result>_>_> __i_2;
  char *pcVar10;
  pointer ptVar11;
  __normal_iterator<time_result_*,_std::vector<time_result,_std::allocator<time_result>_>_> __i;
  long lVar12;
  long lVar13;
  bool bVar14;
  double scanfd;
  pointer ptStack_1a0;
  pointer local_198;
  vector<time_result,_std::allocator<time_result>_> results;
  vector<time_result,_std::allocator<time_result>_> results_1;
  int scanfint;
  int scanfres;
  char *local_130;
  char local_128 [16];
  vector<time_result,_std::allocator<time_result>_> local_118;
  vector<time_result,_std::allocator<time_result>_> local_f8;
  vector<time_result,_std::allocator<time_result>_> local_d8;
  char cstr [16];
  char str [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  poVar7 = std::operator<<((ostream *)&std::cout,"Hello, World!");
  std::endl<char,std::char_traits<char>>(poVar7);
  str[0] = '\0';
  str[1] = '\0';
  str[2] = '\0';
  str[3] = '\0';
  str[4] = '\0';
  str[5] = '\0';
  str[6] = '\0';
  str[7] = '\0';
  str[8] = '\0';
  str[9] = '\0';
  str[10] = '\0';
  str[0xb] = '\0';
  str[0xc] = '\0';
  str[0xd] = '\0';
  str[0xe] = '\0';
  str[0xf] = '\0';
  cstr[0] = '\0';
  cstr[1] = '\0';
  cstr[2] = '\0';
  cstr[3] = '\0';
  cstr[4] = '\0';
  cstr[5] = '\0';
  cstr[6] = '\0';
  cstr[7] = '\0';
  cstr[8] = '\0';
  cstr[9] = '\0';
  cstr[10] = '\0';
  cstr[0xb] = '\0';
  cstr[0xc] = '\0';
  cstr[0xd] = '\0';
  cstr[0xe] = '\0';
  cstr[0xf] = '\0';
  lVar9 = 0;
  while( true ) {
    if (lVar9 == 0x24) break;
    __val = *(uint *)((long)&DAT_001054f0 + lVar9);
    std::__cxx11::to_string((string *)&results_1,__val);
    std::operator+(&local_50,"int -> string: ",(string *)&results_1);
    results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    scanfd = 0.0;
    ptStack_1a0 = (pointer)0x0;
    local_198 = (pointer)0x0;
    _scanfres = (pointer)std::chrono::_V2::steady_clock::now();
    lVar12 = 1000000;
    while (bVar14 = lVar12 != 0, lVar12 = lVar12 + -1, bVar14) {
      iVar5 = sprintf(str,"%d",(ulong)__val);
      if (iVar5 == 0x2b) {
        puts(
            "you should not see this output because (==43) is never true, it\'s just used to avoid compiler optimisation in the benchmark\n"
            );
      }
    }
    _scanfres = (pointer)bench::timer::diff((timer *)&scanfres);
    local_130 = "sprintf";
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_0>,bench::func_holder<main::$_1>,bench::func_holder<main::$_2>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_0>,bench::func_holder<main::$_1>,bench::func_holder<main::$_2>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__0>,bench::func_holder<main::__1>,bench::func_holder<main::__2>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__0>,bench::func_holder<main::__1>,bench::func_holder<main::__2>)const::time_result>>
                  *)&results,(time_result *)&scanfres);
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_0>,bench::func_holder<main::$_1>,bench::func_holder<main::$_2>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_0>,bench::func_holder<main::$_1>,bench::func_holder<main::$_2>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__0>,bench::func_holder<main::__1>,bench::func_holder<main::__2>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__0>,bench::func_holder<main::__1>,bench::func_holder<main::__2>)const::time_result>>
                  *)&scanfd,
                 results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1);
    _scanfint = (duration)std::chrono::_V2::steady_clock::now();
    lVar12 = 1000000;
    while (bVar14 = lVar12 != 0, lVar12 = lVar12 + -1, bVar14) {
      std::__cxx11::to_string((string *)&scanfres,__val);
      cVar2 = *_scanfres;
      std::__cxx11::string::~string((string *)&scanfres);
      if (cVar2 == '+') {
        puts(
            "you should not see this output because (==43) is never true, it\'s just used to avoid compiler optimisation in the benchmark\n"
            );
      }
    }
    _scanfres = (pointer)bench::timer::diff((timer *)&scanfint);
    local_130 = "to_str";
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_0>,bench::func_holder<main::$_1>,bench::func_holder<main::$_2>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_0>,bench::func_holder<main::$_1>,bench::func_holder<main::$_2>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__0>,bench::func_holder<main::__1>,bench::func_holder<main::__2>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__0>,bench::func_holder<main::__1>,bench::func_holder<main::__2>)const::time_result>>
                  *)&results,(time_result *)&scanfres);
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_0>,bench::func_holder<main::$_1>,bench::func_holder<main::$_2>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_0>,bench::func_holder<main::$_1>,bench::func_holder<main::$_2>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__0>,bench::func_holder<main::__1>,bench::func_holder<main::__2>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__0>,bench::func_holder<main::__1>,bench::func_holder<main::__2>)const::time_result>>
                  *)&scanfd,
                 results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1);
    _scanfres = (pointer)std::chrono::_V2::steady_clock::now();
    lVar12 = 1000000;
    while (bVar14 = lVar12 != 0, lVar12 = lVar12 + -1, bVar14) {
      iVar5 = konvert::itoa(__val,cstr);
      if (iVar5 == 0x2b) {
        puts(
            "you should not see this output because (==43) is never true, it\'s just used to avoid compiler optimisation in the benchmark\n"
            );
      }
    }
    _scanfres = (pointer)bench::timer::diff((timer *)&scanfres);
    local_130 = "konvert";
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_0>,bench::func_holder<main::$_1>,bench::func_holder<main::$_2>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_0>,bench::func_holder<main::$_1>,bench::func_holder<main::$_2>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__0>,bench::func_holder<main::__1>,bench::func_holder<main::__2>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__0>,bench::func_holder<main::__1>,bench::func_holder<main::__2>)const::time_result>>
                  *)&results,(time_result *)&scanfres);
    ptVar4 = results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
             super__Vector_impl_data._M_finish;
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_0>,bench::func_holder<main::$_1>,bench::func_holder<main::$_2>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_0>,bench::func_holder<main::$_1>,bench::func_holder<main::$_2>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__0>,bench::func_holder<main::__1>,bench::func_holder<main::__2>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__0>,bench::func_holder<main::__1>,bench::func_holder<main::__2>)const::time_result>>
                  *)&scanfd,
                 results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1);
    ptVar3 = results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
        super__Vector_impl_data._M_start != ptVar4) {
      lVar13 = (long)ptVar4 -
               (long)results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                     super__Vector_impl_data._M_start;
      uVar8 = lVar13 >> 4;
      lVar12 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar12 == 0; lVar12 = lVar12 + -1) {
        }
      }
      std::operator()(results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                      super__Vector_impl_data._M_start,ptVar4,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar13 < 0x101) {
        std::operator()(ptVar3,ptVar4);
      }
      else {
        ptVar11 = ptVar3 + 0x10;
        std::operator()(ptVar3,ptVar11);
        for (; ptVar11 != ptVar4; ptVar11 = ptVar11 + 1) {
          std::operator()(ptVar11);
        }
      }
    }
    bench::console::separator();
    printf("%s   run time :: %s %-10s %s x%li %s \n%*s\n","\x1b[0;37m","\x1b[0;34m",
           local_50._M_dataplus._M_p,"\x1b[0;35m",1000000,"\x1b[0;37m",0x39,"iterations/sec");
    printf(anon_var_dwarf_7fb9,SUB84(ptVar3->time,0),1000000.0 / ptVar3->time,"\x1b[0;32m",0xf,
           ptVar3->desc,"\x1b[0;37m","\x1b[0;32m","\x1b[0m");
    lVar12 = 3;
    for (lVar13 = 2; lVar13 - 1U < (ulong)((long)ptVar4 - (long)ptVar3 >> 4); lVar13 = lVar13 + 1) {
      dVar1 = *(double *)((long)ptVar3 + lVar12 * 8 + -8);
      printf("%s%zu. %-*s %s   x%-6.2f%*s%s%-6.4fs      %4.2f\n",SUB84(dVar1 / ptVar3->time,0),dVar1
             ,1000000.0 / dVar1,"\x1b[0;37m",lVar13,0xf,(&ptVar3->time)[lVar12],"\x1b[0;91m",
             (ulong)((int)lVar12 + 1)," ","\x1b[0m");
      lVar12 = lVar12 + 2;
    }
    puts("\n");
    local_d8.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)scanfd;
    local_d8.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_finish = ptStack_1a0;
    local_d8.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = local_198;
    scanfd = 0.0;
    ptStack_1a0 = (pointer)0x0;
    local_198 = (pointer)0x0;
    std::vector<time_result,_std::allocator<time_result>_>::~vector
              ((vector<time_result,_std::allocator<time_result>_> *)&scanfd);
    std::vector<time_result,_std::allocator<time_result>_>::~vector(&results);
    std::vector<time_result,_std::allocator<time_result>_>::~vector(&local_d8);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&results_1);
    poVar7 = std::operator<<((ostream *)&std::cout,"konvert   : ");
    iVar5 = konvert::itoa(__val,cstr);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
    poVar7 = std::operator<<(poVar7," = \"");
    poVar7 = std::operator<<(poVar7,cstr);
    poVar7 = std::operator<<(poVar7,"\"\n");
    poVar7 = std::operator<<(poVar7,"sprintf   : ");
    iVar5 = sprintf(str,"%d",(ulong)__val);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar5);
    poVar7 = std::operator<<(poVar7," = \"");
    poVar7 = std::operator<<(poVar7,str);
    poVar7 = std::operator<<(poVar7,"\"\n");
    poVar7 = std::operator<<(poVar7,"to_string : \"");
    std::__cxx11::to_string((string *)&scanfres,__val);
    poVar7 = std::operator<<(poVar7,(string *)&scanfres);
    std::operator<<(poVar7,"\"\n");
    std::__cxx11::string::~string((string *)&scanfres);
    lVar9 = lVar9 + 4;
  }
  iVar5 = 0;
  pcVar10 = 
  "42            -1            666666666666  -666          -23489535     0             1028455535    -502345535    202345535     1232348935    450234535     9999999999999 026026        4             502348965     "
  ;
  while( true ) {
    if (iVar5 == 0xf) break;
    _scanfres = local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)&scanfres,pcVar10);
    std::operator+(&local_70,"string -> int: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scanfres);
    results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    scanfd = (double)std::chrono::_V2::steady_clock::now();
    lVar9 = 1000000;
    while (bVar14 = lVar9 != 0, lVar9 = lVar9 + -1, bVar14) {
      iVar6 = konvert::atoi<int,unsigned_int>(pcVar10);
      if (iVar6 == 0x2b) {
        puts(
            "you should not see this output because (==43) is never true, it\'s just used to avoid compiler optimisation in the benchmark\n"
            );
      }
    }
    scanfd = bench::timer::diff((timer *)&scanfd);
    ptStack_1a0 = (pointer)0x10512a;
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result>>
                  *)&results_1,(time_result *)&scanfd);
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result>>
                  *)&results,
                 results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1);
    scanfd = (double)std::chrono::_V2::steady_clock::now();
    lVar9 = 1000000;
    while (bVar14 = lVar9 != 0, lVar9 = lVar9 + -1, bVar14) {
      iVar6 = atoi(pcVar10);
      if (iVar6 == 0x2b) {
        puts(
            "you should not see this output because (==43) is never true, it\'s just used to avoid compiler optimisation in the benchmark\n"
            );
      }
    }
    scanfd = bench::timer::diff((timer *)&scanfd);
    ptStack_1a0 = (pointer)0x105248;
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result>>
                  *)&results_1,(time_result *)&scanfd);
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result>>
                  *)&results,
                 results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1);
    scanfd = (double)std::chrono::_V2::steady_clock::now();
    lVar9 = 1000000;
    while (bVar14 = lVar9 != 0, lVar9 = lVar9 + -1, bVar14) {
      lVar12 = strtol(pcVar10,(char **)0x0,10);
      if (lVar12 == 0x2b) {
        puts(
            "you should not see this output because (==43) is never true, it\'s just used to avoid compiler optimisation in the benchmark\n"
            );
      }
    }
    scanfd = bench::timer::diff((timer *)&scanfd);
    ptStack_1a0 = (pointer)0x10524d;
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result>>
                  *)&results_1,(time_result *)&scanfd);
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result>>
                  *)&results,
                 results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1);
    scanfd = (double)std::chrono::_V2::steady_clock::now();
    lVar9 = 1000000;
    while (bVar14 = lVar9 != 0, lVar9 = lVar9 + -1, bVar14) {
      __isoc99_sscanf(pcVar10,"%d",&scanfint);
      if (scanfint == 0x2b) {
        puts(
            "you should not see this output because (==43) is never true, it\'s just used to avoid compiler optimisation in the benchmark\n"
            );
      }
    }
    scanfd = bench::timer::diff((timer *)&scanfd);
    ptStack_1a0 = (pointer)0x105254;
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result>>
                  *)&results_1,(time_result *)&scanfd);
    ptVar4 = results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
             super__Vector_impl_data._M_finish;
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_3>,bench::func_holder<main::$_4>,bench::func_holder<main::$_5>,bench::func_holder<main::$_6>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__3>,bench::func_holder<main::__4>,bench::func_holder<main::__5>,bench::func_holder<main::__6>)const::time_result>>
                  *)&results,
                 results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1);
    ptVar3 = results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
        super__Vector_impl_data._M_start != ptVar4) {
      lVar12 = (long)ptVar4 -
               (long)results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl
                     .super__Vector_impl_data._M_start;
      uVar8 = lVar12 >> 4;
      lVar9 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      std::operator()(results_1.super__Vector_base<time_result,_std::allocator<time_result>_>.
                      _M_impl.super__Vector_impl_data._M_start,ptVar4,
                      ((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar12 < 0x101) {
        std::operator()(ptVar3,ptVar4);
      }
      else {
        ptVar11 = ptVar3 + 0x10;
        std::operator()(ptVar3,ptVar11);
        for (; ptVar11 != ptVar4; ptVar11 = ptVar11 + 1) {
          std::operator()(ptVar11);
        }
      }
    }
    bench::console::separator();
    printf("%s   run time :: %s %-10s %s x%li %s \n%*s\n","\x1b[0;37m","\x1b[0;34m",
           local_70._M_dataplus._M_p,"\x1b[0;35m",1000000,"\x1b[0;37m",0x39,"iterations/sec");
    printf(anon_var_dwarf_7fb9,SUB84(ptVar3->time,0),1000000.0 / ptVar3->time,"\x1b[0;32m",0xf,
           ptVar3->desc,"\x1b[0;37m","\x1b[0;32m","\x1b[0m");
    lVar9 = 3;
    for (lVar12 = 2; lVar12 - 1U < (ulong)((long)ptVar4 - (long)ptVar3 >> 4); lVar12 = lVar12 + 1) {
      dVar1 = *(double *)((long)ptVar3 + lVar9 * 8 + -8);
      printf("%s%zu. %-*s %s   x%-6.2f%*s%s%-6.4fs      %4.2f\n",SUB84(dVar1 / ptVar3->time,0),dVar1
             ,1000000.0 / dVar1,"\x1b[0;37m",lVar12,0xf,(&ptVar3->time)[lVar9],"\x1b[0;91m",
             (ulong)((int)lVar9 + 1)," ","\x1b[0m");
      lVar9 = lVar9 + 2;
    }
    puts("\n");
    local_f8.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_start =
         results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_f8.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_finish =
         results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_f8.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<time_result,_std::allocator<time_result>_>::~vector(&results);
    std::vector<time_result,_std::allocator<time_result>_>::~vector(&results_1);
    std::vector<time_result,_std::allocator<time_result>_>::~vector(&local_f8);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&scanfres);
    __isoc99_sscanf(pcVar10,"%d",(string *)&scanfres);
    poVar7 = std::operator<<((ostream *)&std::cout,"konvert   : ");
    iVar6 = konvert::atoi<int,unsigned_int>(pcVar10);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<(poVar7,"konvert_l : ");
    konvert::atoi<long,unsigned_long>(pcVar10);
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<(poVar7,"atoi      : ");
    iVar6 = atoi(pcVar10);
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar6);
    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<(poVar7,"strtol    : ");
    strtol(pcVar10,(char **)0x0,10);
    poVar7 = std::ostream::_M_insert<long>((long)poVar7);
    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
    poVar7 = std::operator<<(poVar7,"sscanf    : ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,scanfres);
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar5 = iVar5 + 1;
    pcVar10 = pcVar10 + 0xe;
  }
  iVar5 = 0;
  pcVar10 = 
  "42.4242       -1.           -66666.666666 42            -2348953.3345 59489.5535    10.28455535   -5023.45535   20.2345535    12323489.3343 45023.4535    99.9999999999 026026.000056 40.           50234896.3345 "
  ;
  while( true ) {
    if (iVar5 == 0xf) break;
    _scanfres = local_128;
    std::__cxx11::string::_M_construct<char_const*>((string *)&scanfres,pcVar10);
    std::operator+(&local_90,"string -> double: ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&scanfres);
    results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    scanfd = (double)std::chrono::_V2::steady_clock::now();
    lVar9 = 1000000;
    while (bVar14 = lVar9 != 0, lVar9 = lVar9 + -1, bVar14) {
      dVar1 = konvert::atof(pcVar10);
      if ((dVar1 == 43.0) && (!NAN(dVar1))) {
        puts(
            "you should not see this output because (==43) is never true, it\'s just used to avoid compiler optimisation in the benchmark\n"
            );
      }
    }
    scanfd = bench::timer::diff((timer *)&scanfd);
    ptStack_1a0 = (pointer)0x10512a;
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result>>
                  *)&results_1,(time_result *)&scanfd);
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result>>
                  *)&results,
                 results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1);
    scanfd = (double)std::chrono::_V2::steady_clock::now();
    lVar9 = 1000000;
    while (bVar14 = lVar9 != 0, lVar9 = lVar9 + -1, bVar14) {
      dVar1 = atof(pcVar10);
      if ((dVar1 == 43.0) && (!NAN(dVar1))) {
        puts(
            "you should not see this output because (==43) is never true, it\'s just used to avoid compiler optimisation in the benchmark\n"
            );
      }
    }
    scanfd = bench::timer::diff((timer *)&scanfd);
    ptStack_1a0 = (pointer)0x105374;
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result>>
                  *)&results_1,(time_result *)&scanfd);
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result>>
                  *)&results,
                 results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1);
    scanfd = (double)std::chrono::_V2::steady_clock::now();
    lVar9 = 1000000;
    while (bVar14 = lVar9 != 0, lVar9 = lVar9 + -1, bVar14) {
      dVar1 = strtod(pcVar10,(char **)0x0);
      if ((dVar1 == 43.0) && (!NAN(dVar1))) {
        puts(
            "you should not see this output because (==43) is never true, it\'s just used to avoid compiler optimisation in the benchmark\n"
            );
      }
    }
    scanfd = bench::timer::diff((timer *)&scanfd);
    ptStack_1a0 = (pointer)0x105379;
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result>>
                  *)&results_1,(time_result *)&scanfd);
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result>>
                  *)&results,
                 results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1);
    _scanfint = (duration)std::chrono::_V2::steady_clock::now();
    lVar9 = 1000000;
    while (bVar14 = lVar9 != 0, lVar9 = lVar9 + -1, bVar14) {
      __isoc99_sscanf(pcVar10,"%lf",&scanfd);
      if ((scanfd == 43.0) && (!NAN(scanfd))) {
        puts(
            "you should not see this output because (==43) is never true, it\'s just used to avoid compiler optimisation in the benchmark\n"
            );
      }
    }
    scanfd = bench::timer::diff((timer *)&scanfint);
    ptStack_1a0 = (pointer)0x105254;
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result>>
                  *)&results_1,(time_result *)&scanfd);
    ptVar4 = results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
             super__Vector_impl_data._M_finish;
    std::
    vector<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result,std::allocator<bench::$_0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::$_7>,bench::func_holder<main::$_8>,bench::func_holder<main::$_9>,bench::func_holder<main::$_10>)const::time_result>>
    ::operator()((vector<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result,std::allocator<bench::__0::TEMPNAMEPLACEHOLDERVALUE(long,std::__cxx11::string,bench::func_holder<main::__7>,bench::func_holder<main::__8>,bench::func_holder<main::__9>,bench::func_holder<main::__10>)const::time_result>>
                  *)&results,
                 results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
                 super__Vector_impl_data._M_finish + -1);
    ptVar3 = results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
        super__Vector_impl_data._M_start != ptVar4) {
      lVar12 = (long)ptVar4 -
               (long)results_1.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl
                     .super__Vector_impl_data._M_start;
      uVar8 = lVar12 >> 4;
      lVar9 = 0x3f;
      if (uVar8 != 0) {
        for (; uVar8 >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      std::operator()(results_1.super__Vector_base<time_result,_std::allocator<time_result>_>.
                      _M_impl.super__Vector_impl_data._M_start,ptVar4,
                      ((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar12 < 0x101) {
        std::operator()(ptVar3,ptVar4);
      }
      else {
        ptVar11 = ptVar3 + 0x10;
        std::operator()(ptVar3,ptVar11);
        for (; ptVar11 != ptVar4; ptVar11 = ptVar11 + 1) {
          std::operator()(ptVar11);
        }
      }
    }
    bench::console::separator();
    printf("%s   run time :: %s %-10s %s x%li %s \n%*s\n","\x1b[0;37m","\x1b[0;34m",
           local_90._M_dataplus._M_p,"\x1b[0;35m",1000000,"\x1b[0;37m",0x39,"iterations/sec");
    printf(anon_var_dwarf_7fb9,SUB84(ptVar3->time,0),1000000.0 / ptVar3->time,"\x1b[0;32m",0xf,
           ptVar3->desc,"\x1b[0;37m","\x1b[0;32m","\x1b[0m");
    lVar9 = 3;
    for (lVar12 = 2; lVar12 - 1U < (ulong)((long)ptVar4 - (long)ptVar3 >> 4); lVar12 = lVar12 + 1) {
      dVar1 = *(double *)((long)ptVar3 + lVar9 * 8 + -8);
      printf("%s%zu. %-*s %s   x%-6.2f%*s%s%-6.4fs      %4.2f\n",SUB84(dVar1 / ptVar3->time,0),dVar1
             ,1000000.0 / dVar1,"\x1b[0;37m",lVar12,0xf,(&ptVar3->time)[lVar9],"\x1b[0;91m",
             (ulong)((int)lVar9 + 1)," ","\x1b[0m");
      lVar9 = lVar9 + 2;
    }
    puts("\n");
    local_118.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_start =
         results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_118.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_finish =
         results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_118.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    results.super__Vector_base<time_result,_std::allocator<time_result>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<time_result,_std::allocator<time_result>_>::~vector(&results);
    std::vector<time_result,_std::allocator<time_result>_>::~vector(&results_1);
    std::vector<time_result,_std::allocator<time_result>_>::~vector(&local_118);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&scanfres);
    __isoc99_sscanf(pcVar10,"%lf",(string *)&scanfres);
    *(undefined8 *)(std::__cxx11::string::string + *(long *)(std::cout + -0x18)) = 0x10;
    std::operator<<((ostream *)&std::cout,"konvert : ");
    dVar1 = konvert::atof(pcVar10);
    poVar7 = std::ostream::_M_insert<double>(dVar1);
    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
    std::operator<<(poVar7,"atof    : ");
    dVar1 = atof(pcVar10);
    poVar7 = std::ostream::_M_insert<double>(dVar1);
    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
    std::operator<<(poVar7,"strtod  : ");
    dVar1 = strtod(pcVar10,(char **)0x0);
    poVar7 = std::ostream::_M_insert<double>(dVar1);
    poVar7 = std::endl<char,std::char_traits<char>>(poVar7);
    std::operator<<(poVar7,"sscanf  : ");
    poVar7 = std::ostream::_M_insert<double>((double)_scanfres);
    std::endl<char,std::char_traits<char>>(poVar7);
    iVar5 = iVar5 + 1;
    pcVar10 = pcVar10 + 0xe;
  }
  return 0;
}

Assistant:

int main() {

  std::cout << "Hello, World!" << std::endl;

  /**
   * Benchmark int to string conversion
   */

  int ints[] = { 42, -1, 1600066666, -666, 0, -502345535, 26026, 4, 1999999990 };

  const char *hint =
    "you should not see this output because (==43) is never true, "
    "it's just used to avoid compiler optimisation in the benchmark\n";

  char str[16]  = "";
  char cstr[16] = "";

  for(auto const value: ints){

    time_compare(
      1000000u, "int -> string: " +  std::to_string(value),

      func("sprintf",   [&]{ if( sprintf(str, "%d", value) == 43      ) printf("%s\n",hint); }),
      func("to_str",    [&]{ if( *std::to_string(value).c_str() == 43 ) printf("%s\n",hint); }),
      func("konvert",   [&]{ if( konvert::itoa(value, cstr) == 43     ) printf("%s\n",hint); })
    );

    { std::cout << "konvert   : " << konvert::itoa(value, cstr) << " = \"" << cstr << "\"\n"
                << "sprintf   : " << sprintf(str, "%d", value)  << " = \"" << str  << "\"\n"
                << "to_string : \"" << std::to_string(value) << "\"\n"; }
  }


  /**
   * Benchmark konvert::atoi vs system alternatives
   * - atoi
   * - sscanf("%d")
   */

  const char *str_ints =
    "42            -1            666666666666  -666          -23489535     "
    "0             1028455535    -502345535    202345535     1232348935    "
    "450234535     9999999999999 026026        4             502348965     ";

  unsigned long separation = 14;
  auto pos = str_ints;


  for(auto t=0; t<15; t++) {

    time_compare(
      1000000u, "string -> int: " +  std::string(pos,separation),

      func("konvert",   [&]{ if( konvert::atoi(pos) == 43 )       printf("%s\n",hint); }),
      func("atoi",      [&]{ if( atoi(pos) == 43 )                printf("%s\n",hint); }),
      func("strtol",    [&]{ if( strtol(pos, nullptr,10) == 43 )  printf("%s\n",hint); }),
      func("scanf",     [&]{
        int scanfint; sscanf(pos,"%d",&scanfint);
        if( scanfint == 43 ) printf("%s\n",hint); })
    );

    { int scanfres; sscanf(pos, "%d", &scanfres);
      std::cout << "konvert   : " << konvert::atoi(pos)      << std::endl
                << "konvert_l : " << konvert::atol(pos)      << std::endl
                << "atoi      : " << atoi(pos)               << std::endl
                << "strtol    : " << strtol(pos, nullptr,10) << std::endl
                << "sscanf    : " << scanfres                << std::endl; }

    pos += separation;
  }


  /**
   * Benchmark konvert::atof vs system alternatives
   * - atof
   * - sscanf("%lf")
   */

  const char *str_doubles =
    "42.4242       -1.           -66666.666666 42            -2348953.3345 "
    "59489.5535    10.28455535   -5023.45535   20.2345535    12323489.3343 "
    "45023.4535    99.9999999999 026026.000056 40.           50234896.3345 ";

  pos = str_doubles;
  for(auto t=0; t<15; t++){

    time_compare(
      1000000u, "string -> double: " + std::string(pos,separation),

      func("konvert", [&]{ if( konvert::atof(pos) == 43.0 )   printf("%s\n",hint); }),
      func("atof",    [&]{ if( atof(pos) == 43.0 )            printf("%s\n",hint); }),
      func("strtod",  [&]{ if( strtod(pos, nullptr) == 43.0 ) printf("%s\n",hint); }),
      func("scanf",   [&]{
        double scanfd; sscanf(pos,"%lf",&scanfd);
        if( scanfd == 43.0 ) printf("%s\n",hint); })
    );


    { double scanfd; sscanf(pos, "%lf", &scanfd);
      std::cout << std::setprecision(16)
                << "konvert : " << konvert::atof(pos)   << std::endl
                << "atof    : " << atof(pos)            << std::endl
                << "strtod  : " << strtod(pos, nullptr) << std::endl
                << "sscanf  : " << scanfd               << std::endl; }

    pos += separation;
  }
}